

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::SetEncoderVelocityData(AmpIO *this,uint index)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = this->NumEncoders;
  if (index < uVar1) {
    uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar2 < 6) {
      EncoderVelocity::SetDataOld
                (this->encVelData + index,this->ReadBuffer[this->ENC_VEL_OFFSET + index],3 < uVar2);
    }
    else if (uVar2 == 6) {
      EncoderVelocity::SetDataRev6
                (this->encVelData + index,this->ReadBuffer[this->ENC_VEL_OFFSET + index],
                 this->ReadBuffer[this->ENC_QTR1_OFFSET + index]);
    }
    else {
      uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
      EncoderVelocity::SetData
                (this->encVelData + index,this->ReadBuffer[this->ENC_VEL_OFFSET + index],
                 this->ReadBuffer[this->ENC_QTR1_OFFSET + index],
                 this->ReadBuffer[this->ENC_QTR5_OFFSET + index],
                 this->ReadBuffer[this->ENC_RUN_OFFSET + index],uVar2 == 0x64524131);
    }
    if (this->encVelData[index].encError == true) {
      this->encErrorCount[index] = this->encErrorCount[index] + 1;
    }
  }
  return index < uVar1;
}

Assistant:

bool AmpIO::SetEncoderVelocityData(unsigned int index)
{
    if (index >= NumEncoders)
        return false;

    uint32_t fver = GetFirmwareVersion();
    if (fver < 6) {
        encVelData[index].SetDataOld(ReadBuffer[ENC_VEL_OFFSET+index], (fver >= 4));
    }
    else if (fver == 6) {
        encVelData[index].SetDataRev6(ReadBuffer[ENC_VEL_OFFSET+index], ReadBuffer[ENC_QTR1_OFFSET+index]);
    }
    else {  // V7+
        bool isESPM = (GetHardwareVersion() == dRA1_String);
        encVelData[index].SetData(ReadBuffer[ENC_VEL_OFFSET+index], ReadBuffer[ENC_QTR1_OFFSET+index],
                                  ReadBuffer[ENC_QTR5_OFFSET+index], ReadBuffer[ENC_RUN_OFFSET+index], isESPM);
    }
    // Increment error counter if necessary
    if (encVelData[index].IsEncoderError())
        encErrorCount[index]++;

    return true;
}